

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

char * __thiscall QFileSystemModel::index(QFileSystemModel *this,char *__s,int __c)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *pNVar5;
  QFileSystemNode **ppQVar6;
  QFileSystemNode *pQVar7;
  uint in_ECX;
  long lVar8;
  uint *in_R8;
  bool bVar9;
  
  if (-1 < (int)(in_ECX | __c)) {
    lVar2 = *(long *)(__s + 8);
    iVar3 = (**(code **)(*(long *)__s + 0x78))(__s);
    if ((__c < iVar3) && (iVar3 = (**(code **)(*(long *)__s + 0x80))(__s), (int)in_ECX < iVar3)) {
      bVar9 = (int)(in_R8[1] | *in_R8) < 0;
      if ((bVar9) || (*(long *)(in_R8 + 4) != *(long *)(lVar2 + 8))) {
        lVar4 = lVar2 + 0x138;
      }
      else {
        lVar8 = lVar2 + 0x138;
        if (*(long *)(in_R8 + 4) != 0) {
          lVar8 = *(long *)(in_R8 + 2);
        }
        lVar4 = lVar2 + 0x138;
        if (!bVar9) {
          lVar4 = lVar8;
        }
      }
      iVar3 = __c;
      if (*(int *)(lVar2 + 0x1ac) != 0) {
        iVar1 = *(int *)(lVar4 + 0x48);
        if (iVar1 == -1) {
          iVar3 = ~__c + *(int *)(lVar4 + 0x30);
        }
        else if (__c < iVar1) {
          iVar3 = iVar1 + ~__c;
        }
      }
      if ((long)iVar3 < *(long *)(lVar4 + 0x30)) {
        if ((*(Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> **)
              (lVar4 + 0x18) ==
             (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *)0x0)
           || (pNVar5 = QHashPrivate::
                        Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>
                        ::findNode<QString>(*(Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>
                                              **)(lVar4 + 0x18),
                                            (QString *)
                                            ((long)iVar3 * 0x18 + *(long *)(lVar4 + 0x28))),
              pNVar5 == (Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)0x0)) {
          ppQVar6 = (QFileSystemNode **)0x0;
        }
        else {
          ppQVar6 = &pNVar5->value;
        }
        if (ppQVar6 == (QFileSystemNode **)0x0) {
          pQVar7 = (QFileSystemNode *)0x0;
        }
        else {
          pQVar7 = *ppQVar6;
        }
        *(int *)this = __c;
        *(uint *)&this->field_0x4 = in_ECX;
        *(QFileSystemNode **)&this->field_0x8 = pQVar7;
        *(char **)(this + 1) = __s;
        return (char *)this;
      }
    }
  }
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)(this + 1) = 0;
  return (char *)this;
}

Assistant:

QModelIndex QFileSystemModel::index(int row, int column, const QModelIndex &parent) const
{
    Q_D(const QFileSystemModel);
    if (row < 0 || column < 0 || row >= rowCount(parent) || column >= columnCount(parent))
        return QModelIndex();

    // get the parent node
    QFileSystemModelPrivate::QFileSystemNode *parentNode = (d->indexValid(parent) ? d->node(parent) :
                                                   const_cast<QFileSystemModelPrivate::QFileSystemNode*>(&d->root));
    Q_ASSERT(parentNode);

    // now get the internal pointer for the index
    const int i = d->translateVisibleLocation(parentNode, row);
    if (i >= parentNode->visibleChildren.size())
        return QModelIndex();
    const QString &childName = parentNode->visibleChildren.at(i);
    const QFileSystemModelPrivate::QFileSystemNode *indexNode = parentNode->children.value(childName);
    Q_ASSERT(indexNode);

    return createIndex(row, column, indexNode);
}